

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O3

Joint * __thiscall RigidBodyDynamics::Joint::operator=(Joint *this,Joint *joint)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  SpatialVector *pSVar4;
  undefined8 uVar5;
  SpatialVector *pSVar6;
  long lVar7;
  ulong uVar8;
  
  if (this != joint) {
    if ((this->mDoFCount != 0) && (this->mJointAxes != (SpatialVector *)0x0)) {
      operator_delete__(this->mJointAxes);
    }
    this->mJointType = joint->mJointType;
    uVar3 = joint->mDoFCount;
    this->mDoFCount = uVar3;
    pSVar6 = (SpatialVector *)operator_new__((ulong)uVar3 * 0x30);
    this->mJointAxes = pSVar6;
    if ((ulong)uVar3 != 0) {
      lVar7 = 0x20;
      uVar8 = 0;
      do {
        pSVar6 = joint->mJointAxes;
        pSVar4 = this->mJointAxes;
        puVar1 = (undefined8 *)
                 ((long)(pSVar6->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + lVar7 + -0x20);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)(pSVar4->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + lVar7 + -0x20);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        puVar1 = (undefined8 *)
                 ((long)(pSVar6->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + lVar7 + -0x10);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)(pSVar4->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + lVar7 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        puVar1 = (undefined8 *)
                 ((long)(pSVar6->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + lVar7);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)
                 ((long)(pSVar4->super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x30;
      } while (uVar8 < this->mDoFCount);
    }
    this->q_index = joint->q_index;
  }
  return this;
}

Assistant:

Joint& operator= (const Joint &joint) {
		if (this != &joint) {
			if (mDoFCount > 0) {
				assert (mJointAxes);
				delete[] mJointAxes;
			}
			mJointType = joint.mJointType;
			mDoFCount = joint.mDoFCount;

			mJointAxes = new Math::SpatialVector[mDoFCount];

			for (unsigned int i = 0; i < mDoFCount; i++)
				mJointAxes[i] = joint.mJointAxes[i];

			q_index = joint.q_index;
		}
		return *this;
	}